

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpFixed<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  unsigned_long uVar1;
  byte *pbVar2;
  FieldEntry *pFVar3;
  char *pcVar4;
  string *psVar5;
  void *x;
  unsigned_long *puVar6;
  ulong uVar7;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint *puVar8;
  ParseContext *ctx_00;
  ushort uVar9;
  MessageLite *msg_00;
  ushort uVar10;
  uint uVar11;
  long lStack_80;
  unsigned_short local_52;
  FieldEntry *local_50;
  MessageLite *local_48;
  ushort local_40 [8];
  
  local_50 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                       (table,(ulong)data.field_0 >> 0x20);
  uVar10 = local_50->type_card & 0x30;
  if (uVar10 == 0x20) {
    pcVar4 = MpRepeatedFixed<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
  uVar9 = local_50->type_card & 0x1c0;
  uVar11 = data.field_0._0_4_ & 7;
  local_48 = msg;
  if (uVar9 == 0xc0) {
    if (uVar11 != 1) {
LAB_0014fa30:
      UNRECOVERED_JUMPTABLE = table->fallback;
      msg_00 = local_48;
      goto LAB_0014fadd;
    }
  }
  else {
    local_52 = 0x80;
    local_40[0] = uVar9;
    psVar5 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                       (local_40,&local_52,"rep == static_cast<uint16_t>(field_layout::kRep32Bits)")
    ;
    if (psVar5 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x6c3,psVar5->_M_string_length,(psVar5->_M_dataplus)._M_p);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_40);
    }
    if (uVar11 != 5) goto LAB_0014fa30;
  }
  msg_00 = local_48;
  pFVar3 = local_50;
  if (uVar10 == 0x30) {
    ctx_00 = (ParseContext *)((ulong)data.field_0 >> 3 & 0x1fffffff);
    ChangeOneof(table,local_50,(uint32_t)ctx_00,ctx_00,local_48);
  }
  else if (uVar10 == 0x10) {
    pbVar2 = (byte *)((long)&local_48->_vptr_MessageLite + ((long)local_50->has_idx >> 3));
    *pbVar2 = *pbVar2 | '\x01' << (local_50->has_idx & 7U);
  }
  x = MaybeGetSplitBase(msg_00,true,table);
  if (uVar9 == 0xc0) {
    uVar1 = *(unsigned_long *)ptr;
    puVar6 = RefAt<unsigned_long>(x,(ulong)pFVar3->offset);
    *puVar6 = uVar1;
    lStack_80 = 8;
  }
  else {
    uVar11 = *(uint *)ptr;
    puVar8 = RefAt<unsigned_int>(x,(ulong)pFVar3->offset);
    *puVar8 = uVar11;
    lStack_80 = 4;
  }
  ptr = ptr + lStack_80;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar8 = RefAt<unsigned_int>(msg_00,(ulong)table->has_bits_offset);
      *puVar8 = *puVar8 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  uVar11 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar11 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar7 = (ulong)(uVar11 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar7);
LAB_0014fadd:
  pcVar4 = (*UNRECOVERED_JUMPTABLE)(msg_00,ptr,ctx,data,table,hasbits);
  return pcVar4;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpFixed(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing (wiretype fallback is handled there):
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for mismatched wiretype:
  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint32_t decoded_wiretype = data.tag() & 7;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }
  // Set the field present:
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (card == field_layout::kFcOneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  // Copy the value:
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = UnalignedLoad<uint64_t>(ptr);
    ptr += sizeof(uint64_t);
  } else {
    RefAt<uint32_t>(base, entry.offset) = UnalignedLoad<uint32_t>(ptr);
    ptr += sizeof(uint32_t);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}